

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  ulong local_80;
  uchar tmpsig [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tmpsig[0x30] = '\0';
  tmpsig[0x31] = '\0';
  tmpsig[0x32] = '\0';
  tmpsig[0x33] = '\0';
  tmpsig[0x34] = '\0';
  tmpsig[0x35] = '\0';
  tmpsig[0x36] = '\0';
  tmpsig[0x37] = '\0';
  tmpsig[0x38] = '\0';
  tmpsig[0x39] = '\0';
  tmpsig[0x3a] = '\0';
  tmpsig[0x3b] = '\0';
  tmpsig[0x3c] = '\0';
  tmpsig[0x3d] = '\0';
  tmpsig[0x3e] = '\0';
  tmpsig[0x3f] = '\0';
  tmpsig[0x20] = '\0';
  tmpsig[0x21] = '\0';
  tmpsig[0x22] = '\0';
  tmpsig[0x23] = '\0';
  tmpsig[0x24] = '\0';
  tmpsig[0x25] = '\0';
  tmpsig[0x26] = '\0';
  tmpsig[0x27] = '\0';
  tmpsig[0x28] = '\0';
  tmpsig[0x29] = '\0';
  tmpsig[0x2a] = '\0';
  tmpsig[0x2b] = '\0';
  tmpsig[0x2c] = '\0';
  tmpsig[0x2d] = '\0';
  tmpsig[0x2e] = '\0';
  tmpsig[0x2f] = '\0';
  tmpsig[0x10] = '\0';
  tmpsig[0x11] = '\0';
  tmpsig[0x12] = '\0';
  tmpsig[0x13] = '\0';
  tmpsig[0x14] = '\0';
  tmpsig[0x15] = '\0';
  tmpsig[0x16] = '\0';
  tmpsig[0x17] = '\0';
  tmpsig[0x18] = '\0';
  tmpsig[0x19] = '\0';
  tmpsig[0x1a] = '\0';
  tmpsig[0x1b] = '\0';
  tmpsig[0x1c] = '\0';
  tmpsig[0x1d] = '\0';
  tmpsig[0x1e] = '\0';
  tmpsig[0x1f] = '\0';
  tmpsig[0] = '\0';
  tmpsig[1] = '\0';
  tmpsig[2] = '\0';
  tmpsig[3] = '\0';
  tmpsig[4] = '\0';
  tmpsig[5] = '\0';
  tmpsig[6] = '\0';
  tmpsig[7] = '\0';
  tmpsig[8] = '\0';
  tmpsig[9] = '\0';
  tmpsig[10] = '\0';
  tmpsig[0xb] = '\0';
  tmpsig[0xc] = '\0';
  tmpsig[0xd] = '\0';
  tmpsig[0xe] = '\0';
  tmpsig[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,tmpsig);
  iVar3 = 0;
  iVar8 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (iVar8 = iVar3, *input == '0')) {
    bVar1 = input[1];
    if ((char)bVar1 < '\0') {
      if (inputlen - 2 < (ulong)bVar1 - 0x80) goto LAB_0068676d;
      sVar5 = (ulong)bVar1 - 0x7e;
    }
    else {
      sVar5 = 2;
    }
    if (((sVar5 != inputlen) && (input[sVar5] == '\x02')) && (sVar5 + 1 != inputlen)) {
      lVar4 = sVar5 + 2;
      uVar6 = (ulong)input[sVar5 + 1];
      if ((char)input[sVar5 + 1] < '\0') {
        if (inputlen - lVar4 < uVar6 - 0x80) goto LAB_0068676d;
        lVar12 = uVar6 + sVar5 + -0x7e;
        uVar10 = 0;
        uVar7 = uVar6 - 0x80;
        while (uVar7 != 0) {
          if (input[lVar4] != '\0') {
            lVar12 = lVar4;
            uVar10 = uVar7;
            if (3 < uVar7) goto LAB_00686634;
            break;
          }
          lVar4 = lVar4 + 1;
          uVar7 = uVar7 - 1;
        }
        uVar6 = 0;
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          uVar6 = uVar6 << 8 | (ulong)input[uVar11 + lVar12];
        }
        lVar4 = lVar12 + uVar10;
      }
      if (((uVar6 <= inputlen - lVar4) && (sVar5 = lVar4 + uVar6, sVar5 != inputlen)) &&
         ((input[sVar5] == '\x02' && (sVar5 + 1 != inputlen)))) {
        lVar12 = sVar5 + 2;
        uVar10 = (ulong)input[sVar5 + 1];
        if ((char)input[sVar5 + 1] < '\0') {
          if (inputlen - lVar12 < uVar10 - 0x80) goto LAB_0068676d;
          lVar9 = sVar5 + uVar10 + -0x7e;
          uVar7 = uVar10 - 0x80;
          while (uVar7 != 0) {
            if (input[lVar12] != '\0') {
              lVar9 = lVar12;
              local_80 = uVar7;
              if (3 < uVar7) goto LAB_00686634;
              goto LAB_0068679d;
            }
            lVar12 = lVar12 + 1;
            uVar7 = uVar7 - 1;
          }
          local_80 = 0;
LAB_0068679d:
          uVar10 = 0;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            uVar10 = uVar10 << 8 | (ulong)input[uVar11 + lVar9];
          }
          lVar12 = lVar9 + local_80;
        }
        if (uVar10 <= inputlen - lVar12) {
          for (lVar9 = 0; uVar7 = uVar6 - lVar9, uVar7 != 0; lVar9 = lVar9 + 1) {
            if (input[lVar9 + lVar4] != '\0') {
              if (0x20 < uVar7) {
                bVar2 = false;
                goto LAB_006866e8;
              }
              sVar5 = lVar4 + lVar9;
              break;
            }
          }
          __memcpy_chk(tmpsig + (lVar9 - uVar6) + 0x20,input + sVar5,uVar7,uVar7 + 0x20);
          bVar2 = true;
LAB_006866e8:
          lVar4 = uVar10 + lVar12;
          for (lVar9 = -uVar10; iVar8 = 1, lVar9 != 0; lVar9 = lVar9 + 1) {
            if (input[lVar12] != '\0') {
              lVar4 = lVar12;
              if (0x1f < (ulong)-lVar9 && lVar9 != -0x20) goto LAB_0068674a;
              break;
            }
            lVar12 = lVar12 + 1;
          }
          memcpy((void *)((long)&local_38 + lVar9),input + lVar4,-lVar9);
          if ((!bVar2) ||
             (iVar3 = secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,tmpsig),
             iVar3 == 0)) {
LAB_0068674a:
            tmpsig[0x30] = '\0';
            tmpsig[0x31] = '\0';
            tmpsig[0x32] = '\0';
            tmpsig[0x33] = '\0';
            tmpsig[0x34] = '\0';
            tmpsig[0x35] = '\0';
            tmpsig[0x36] = '\0';
            tmpsig[0x37] = '\0';
            tmpsig[0x38] = '\0';
            tmpsig[0x39] = '\0';
            tmpsig[0x3a] = '\0';
            tmpsig[0x3b] = '\0';
            tmpsig[0x3c] = '\0';
            tmpsig[0x3d] = '\0';
            tmpsig[0x3e] = '\0';
            tmpsig[0x3f] = '\0';
            tmpsig[0x20] = '\0';
            tmpsig[0x21] = '\0';
            tmpsig[0x22] = '\0';
            tmpsig[0x23] = '\0';
            tmpsig[0x24] = '\0';
            tmpsig[0x25] = '\0';
            tmpsig[0x26] = '\0';
            tmpsig[0x27] = '\0';
            tmpsig[0x28] = '\0';
            tmpsig[0x29] = '\0';
            tmpsig[0x2a] = '\0';
            tmpsig[0x2b] = '\0';
            tmpsig[0x2c] = '\0';
            tmpsig[0x2d] = '\0';
            tmpsig[0x2e] = '\0';
            tmpsig[0x2f] = '\0';
            tmpsig[0x10] = '\0';
            tmpsig[0x11] = '\0';
            tmpsig[0x12] = '\0';
            tmpsig[0x13] = '\0';
            tmpsig[0x14] = '\0';
            tmpsig[0x15] = '\0';
            tmpsig[0x16] = '\0';
            tmpsig[0x17] = '\0';
            tmpsig[0x18] = '\0';
            tmpsig[0x19] = '\0';
            tmpsig[0x1a] = '\0';
            tmpsig[0x1b] = '\0';
            tmpsig[0x1c] = '\0';
            tmpsig[0x1d] = '\0';
            tmpsig[0x1e] = '\0';
            tmpsig[0x1f] = '\0';
            tmpsig[0] = '\0';
            tmpsig[1] = '\0';
            tmpsig[2] = '\0';
            tmpsig[3] = '\0';
            tmpsig[4] = '\0';
            tmpsig[5] = '\0';
            tmpsig[6] = '\0';
            tmpsig[7] = '\0';
            tmpsig[8] = '\0';
            tmpsig[9] = '\0';
            tmpsig[10] = '\0';
            tmpsig[0xb] = '\0';
            tmpsig[0xc] = '\0';
            tmpsig[0xd] = '\0';
            tmpsig[0xe] = '\0';
            tmpsig[0xf] = '\0';
            secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,tmpsig);
          }
        }
      }
    }
  }
LAB_0068676d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
LAB_00686634:
  iVar8 = 0;
  goto LAB_0068676d;
}

Assistant:

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    if (overflow) {
        /* Overwrite the result again with a correctly-parsed but invalid
           signature if parsing failed. */
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    return 1;
}